

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

String __thiscall doctest::String::operator+(String *this,String *other)

{
  String *in_RDX;
  EVP_PKEY_CTX *src;
  void *local_20;
  
  String((String *)&local_20,other->m_str);
  operator+=((String *)&local_20,in_RDX);
  this->m_str = (char *)0x0;
  copy(this,(EVP_PKEY_CTX *)&local_20,src);
  free(local_20);
  return (String)(char *)this;
}

Assistant:

String String::operator+(const String& other) const { return String(m_str) += other; }